

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
vkt::pipeline::TestTextureCube::getLevel
          (PixelBufferAccess *__return_storage_ptr__,TestTextureCube *this,int level,int layer)

{
  PixelBufferAccess *pPVar1;
  int layer_local;
  int level_local;
  TestTextureCube *this_local;
  
  pPVar1 = tcu::TextureCube::getLevelFace
                     (&this->m_texture,level,*(CubeFace *)(tcuFaceMapping + (long)layer * 4));
  tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,pPVar1);
  return __return_storage_ptr__;
}

Assistant:

tcu::PixelBufferAccess TestTextureCube::getLevel (int level, int layer)
{
	return m_texture.getLevelFace(level, tcuFaceMapping[layer]);
}